

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_ChangeCountFlags
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  VMValue *pVVar7;
  VMValue *pVVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  bool bVar12;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar3 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar12 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar12) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar12 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar12) {
          pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d7fdd;
        }
      }
      if (numparam == 1) {
        pVVar7 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d7ffc:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d0,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar7 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar11 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003d7ffc;
        }
      }
      if (numparam < 3) {
        pVVar8 = defaultparam->Array;
        if (pVVar8[2].field_0.field_3.Type != '\0') {
          pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003d801b;
        }
      }
      else {
        pVVar8 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003d801b:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d1,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar1 = pVVar8[2].field_0.i;
      if (numparam < 4) {
        param = defaultparam->Array;
        if (param[3].field_0.field_3.Type == '\0') goto LAB_003d7eac;
        pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[3].field_0.field_3.Type == '\0') {
LAB_003d7eac:
          iVar2 = param[3].field_0.i;
          uVar10 = *(uint *)((long)puVar3 + 0x1bc);
          if (((uVar10 & 0x8400000) == 0x400000) && (0 < *(int *)((long)puVar3 + 0x1fc))) {
            level.total_monsters = level.total_monsters + -1;
          }
          if ((uVar10 >> 0x17 & 1) != 0) {
            level.total_items = level.total_items + -1;
          }
          uVar9 = *(uint *)((long)puVar3 + 0x1cc);
          if ((uVar9 & 0x10) != 0) {
            level.total_secrets = level.total_secrets + -1;
          }
          if (pVVar7[1].field_0.i != -1) {
            if (pVVar7[1].field_0.i == 0) {
              uVar10 = uVar10 & 0xffbfffff;
            }
            else {
              uVar10 = uVar10 | 0x400000;
            }
            *(uint *)((long)puVar3 + 0x1bc) = uVar10;
          }
          if (iVar1 != -1) {
            if (iVar1 == 0) {
              uVar10 = *(uint *)((long)puVar3 + 0x1bc) & 0xff7fffff;
            }
            else {
              uVar10 = *(uint *)((long)puVar3 + 0x1bc) | 0x800000;
            }
            *(uint *)((long)puVar3 + 0x1bc) = uVar10;
          }
          if (iVar2 != -1) {
            if (iVar2 == 0) {
              uVar9 = uVar9 & 0xffffffef;
            }
            else {
              uVar9 = uVar9 | 0x10;
            }
            *(uint *)((long)puVar3 + 0x1cc) = uVar9;
          }
          if (((*(uint *)((long)puVar3 + 0x1bc) & 0x8400000) == 0x400000) &&
             (0 < *(int *)((long)puVar3 + 0x1fc))) {
            level.total_monsters = level.total_monsters + 1;
          }
          if ((*(uint *)((long)puVar3 + 0x1bc) >> 0x17 & 1) != 0) {
            level.total_items = level.total_items + 1;
          }
          if ((*(byte *)((long)puVar3 + 0x1cc) & 0x10) != 0) {
            level.total_secrets = level.total_secrets + 1;
          }
          return 0;
        }
        pcVar11 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11d2,
                    "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d7fdd:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11cf,
                "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeCountFlags)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(kill);
	PARAM_INT_DEF(item);
	PARAM_INT_DEF(secret);

	if (self->CountsAsKill() && self->health > 0) --level.total_monsters;
	if (self->flags & MF_COUNTITEM) --level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) --level.total_secrets;

	if (kill != -1)
	{
		if (kill == 0) self->flags &= ~MF_COUNTKILL;
		else self->flags |= MF_COUNTKILL;
	}

	if (item != -1)
	{
		if (item == 0) self->flags &= ~MF_COUNTITEM;
		else self->flags |= MF_COUNTITEM;
	}

	if (secret != -1)
	{
		if (secret == 0) self->flags5 &= ~MF5_COUNTSECRET;
		else self->flags5 |= MF5_COUNTSECRET;
	}
	if (self->CountsAsKill() && self->health > 0) ++level.total_monsters;
	if (self->flags & MF_COUNTITEM) ++level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
	return 0;
}